

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O0

Abc_Obj_t * Dec_GraphToNetwork(Abc_Ntk_t *pNtk,Dec_Graph_t *pGraph)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Dec_Node_t *pDVar3;
  Abc_Obj_t *p1;
  int local_3c;
  Dec_Node_t *pDStack_38;
  int i;
  Dec_Node_t *pNode;
  Abc_Obj_t *pAnd1;
  Abc_Obj_t *pAnd0;
  Dec_Graph_t *pGraph_local;
  Abc_Ntk_t *pNtk_local;
  
  pDStack_38 = (Dec_Node_t *)0x0;
  iVar1 = Dec_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Dec_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_3c = pGraph->nLeaves; local_3c < pGraph->nSize; local_3c = local_3c + 1) {
        pDStack_38 = Dec_GraphNode(pGraph,local_3c);
        pDVar3 = Dec_GraphNode(pGraph,(uint)pDStack_38->eEdge0 >> 1 & 0x3fffffff);
        pAVar2 = Abc_ObjNotCond((Abc_Obj_t *)(pDVar3->field_2).pFunc,(uint)pDStack_38->eEdge0 & 1);
        pDVar3 = Dec_GraphNode(pGraph,(uint)pDStack_38->eEdge1 >> 1 & 0x3fffffff);
        p1 = Abc_ObjNotCond((Abc_Obj_t *)(pDVar3->field_2).pFunc,(uint)pDStack_38->eEdge1 & 1);
        pAVar2 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar2,p1);
        (pDStack_38->field_2).pFunc = pAVar2;
      }
      pAVar2 = (Abc_Obj_t *)(pDStack_38->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      pNtk_local = (Abc_Ntk_t *)Abc_ObjNotCond(pAVar2,iVar1);
    }
    else {
      pDVar3 = Dec_GraphVar(pGraph);
      pAVar2 = (Abc_Obj_t *)(pDVar3->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      pNtk_local = (Abc_Ntk_t *)Abc_ObjNotCond(pAVar2,iVar1);
    }
  }
  else {
    pAVar2 = Abc_AigConst1(pNtk);
    iVar1 = Dec_GraphIsComplement(pGraph);
    pNtk_local = (Abc_Ntk_t *)Abc_ObjNotCond(pAVar2,iVar1);
  }
  return (Abc_Obj_t *)pNtk_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description [AIG nodes for the fanins should be assigned to pNode->pFunc
  of the leaves of the graph before calling this procedure.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Dec_GraphToNetwork( Abc_Ntk_t * pNtk, Dec_Graph_t * pGraph )
{
    Abc_Obj_t * pAnd0, * pAnd1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtk), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Abc_ObjNotCond( (Abc_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Abc_ObjNotCond( (Abc_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}